

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateLocalInvocationIndexAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *param_3,Instruction *referenced_from_inst)

{
  mapped_type *this_00;
  undefined4 in_stack_fffffffffffffe48;
  uint32_t uVar1;
  BuiltInsValidator *local_1b0;
  code *local_1a8;
  undefined8 local_1a0;
  _Any_data local_198;
  code *local_188;
  type local_178;
  
  if (this->function_id_ == 0) {
    uVar1 = (referenced_from_inst->inst_).result_id;
    this_00 = std::
              map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
              ::operator[](&this->id_to_at_reference_checks_,
                           (key_type_conflict *)&stack0xfffffffffffffe4c);
    local_1a8 = ValidateLocalInvocationIndexAtReference;
    local_1a0 = 0;
    local_1b0 = this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              (&local_178,(offset_in_BuiltInsValidator_to_subr *)&local_1a8,&local_1b0,decoration,
               built_in_inst,referenced_from_inst,
               (_Placeholder<1> *)CONCAT44(uVar1,in_stack_fffffffffffffe48));
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)local_198._M_pod_data,
               &local_178);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(this_00,(value_type *)&local_198);
    if (local_188 != (code *)0x0) {
      (*local_188)(&local_198,&local_198,__destroy_functor);
    }
    std::
    _Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
    ::~_Tuple_impl((_Tuple_impl<1UL,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>_>
                    *)&local_178._M_bound_args);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateLocalInvocationIndexAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction&,
    const Instruction& referenced_from_inst) {
  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(
        std::bind(&BuiltInsValidator::ValidateLocalInvocationIndexAtReference,
                  this, decoration, built_in_inst, referenced_from_inst,
                  std::placeholders::_1));
  }

  return SPV_SUCCESS;
}